

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operation.cc
# Opt level: O2

ostream * operator<<(ostream *out,Operation *op)

{
  int iVar1;
  ostream *poVar2;
  
  (*op->_vptr_Operation[2])(op);
  poVar2 = std::ostream::_M_insert<long>((long)out);
  poVar2 = std::operator<<(poVar2,' ');
  iVar1 = (*op->_vptr_Operation[4])(op);
  poVar2 = std::operator<<(poVar2,(char)iVar1);
  poVar2 = std::operator<<(poVar2,' ');
  (*op->_vptr_Operation[3])(op);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2," = ");
  (*op->_vptr_Operation[5])(op);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  return poVar2;
}

Assistant:

ostream &operator<<(ostream &out, const Operation &op)
{
	return out << op.left() << ' ' << op.opchar() << ' ' << op.right()
		   << " = " << op.result();
}